

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O2

void __thiscall PFData_test_setIndexOrder_Test::TestBody(PFData_test_setIndexOrder_Test *this)

{
  int iVar1;
  AssertionResult *message;
  char *pcVar2;
  int i;
  long lVar3;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar;
  AssertHelper local_390;
  PFData test_read;
  PFData test;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  double data [24];
  
  memset(&test,0,0xa8);
  PFData::PFData(&test);
  for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 1) {
    iVar1 = rand();
    data[lVar3] = (double)iVar1 / 1000.0;
  }
  PFData::setData(&test,data);
  PFData::getIndexOrder_abi_cxx11_(&test_read.m_filename,&test);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"test.getIndexOrder()","\"zyx\"",&test_read.m_filename,
             (char (*) [4])"zyx");
  std::__cxx11::string::~string((string *)&test_read);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&test_read);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2ba,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&test_read);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    if ((long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                         (char)test_read.m_filename._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                                     (char)test_read.m_filename._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_f8,"xyz",(allocator *)&test_read);
  PFData::setIndexOrder(&test,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  PFData::getIndexOrder_abi_cxx11_(&test_read.m_filename,&test);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"test.getIndexOrder()","\"xyz\"",&test_read.m_filename,
             (char (*) [4])"xyz");
  std::__cxx11::string::~string((string *)&test_read);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&test_read);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2be,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&test_read);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    if ((long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                         (char)test_read.m_filename._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                                     (char)test_read.m_filename._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_118,"xYz",(allocator *)&test_read);
  PFData::setIndexOrder(&test,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  PFData::getIndexOrder_abi_cxx11_(&test_read.m_filename,&test);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"test.getIndexOrder()","\"xyz\"",&test_read.m_filename,
             (char (*) [4])"xyz");
  std::__cxx11::string::~string((string *)&test_read);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&test_read);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2c2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&test_read);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    if ((long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                         (char)test_read.m_filename._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                                     (char)test_read.m_filename._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_138,"xYZ",(allocator *)&test_read);
  PFData::setIndexOrder(&test,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  PFData::getIndexOrder_abi_cxx11_(&test_read.m_filename,&test);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"test.getIndexOrder()","\"xyz\"",&test_read.m_filename,
             (char (*) [4])"xyz");
  std::__cxx11::string::~string((string *)&test_read);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&test_read);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2c6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&test_read);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    if ((long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                         (char)test_read.m_filename._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                                     (char)test_read.m_filename._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_158,"XYZ",(allocator *)&test_read);
  PFData::setIndexOrder(&test,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  PFData::getIndexOrder_abi_cxx11_(&test_read.m_filename,&test);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"test.getIndexOrder()","\"xyz\"",&test_read.m_filename,
             (char (*) [4])"xyz");
  std::__cxx11::string::~string((string *)&test_read);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&test_read);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2ca,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&test_read);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    if ((long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                         (char)test_read.m_filename._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                                     (char)test_read.m_filename._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_178,"XYZZZZ",(allocator *)&test_read);
  PFData::setIndexOrder(&test,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  PFData::getIndexOrder_abi_cxx11_(&test_read.m_filename,&test);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"test.getIndexOrder()","\"xyz\"",&test_read.m_filename,
             (char (*) [4])"xyz");
  std::__cxx11::string::~string((string *)&test_read);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&test_read);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2ce,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&test_read);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    if ((long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                         (char)test_read.m_filename._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                                     (char)test_read.m_filename._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string((string *)&local_198,"abc",(allocator *)&test_read);
  PFData::setIndexOrder(&test,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  PFData::getIndexOrder_abi_cxx11_(&test_read.m_filename,&test);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&gtest_ar,"test.getIndexOrder()","\"xyz\"",&test_read.m_filename,
             (char (*) [4])"xyz");
  std::__cxx11::string::~string((string *)&test_read);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&test_read);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2d2,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&test_read);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
    if ((long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                         (char)test_read.m_filename._M_dataplus._M_p) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                                     (char)test_read.m_filename._M_dataplus._M_p) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::string
            ((string *)&local_1b8,"tests/test_write_index_order.pfb",(allocator *)&local_390);
  gtest_ar._0_4_ = PFData::writeFile(&test,&local_1b8);
  gtest_ar_11.success_ = true;
  gtest_ar_11._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&test_read,"test.writeFile(\"tests/test_write_index_order.pfb\")","1",
             (int *)&gtest_ar,(int *)&gtest_ar_11);
  std::__cxx11::string::~string((string *)&local_1b8);
  if ((char)test_read.m_filename._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (test_read.m_filename._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)test_read.m_filename._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2d5,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&gtest_ar);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&test_read.m_filename._M_string_length);
    std::__cxx11::string::string((string *)&local_1d8,"ZYX",(allocator *)&test_read);
    PFData::setIndexOrder(&test,&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
    PFData::getIndexOrder_abi_cxx11_(&test_read.m_filename,&test);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
              ((internal *)&gtest_ar,"test.getIndexOrder()","\"zyx\"",&test_read.m_filename,
               (char (*) [4])"zyx");
    std::__cxx11::string::~string((string *)&test_read);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&test_read);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
                 ,0x2d9,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&test_read)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
      if ((long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                           (char)test_read.m_filename._M_dataplus._M_p) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                                       (char)test_read.m_filename._M_dataplus._M_p) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    std::__cxx11::string::string((string *)&local_1f8,"zYx",(allocator *)&test_read);
    PFData::setIndexOrder(&test,&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    PFData::getIndexOrder_abi_cxx11_(&test_read.m_filename,&test);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
              ((internal *)&gtest_ar,"test.getIndexOrder()","\"zyx\"",&test_read.m_filename,
               (char (*) [4])"zyx");
    std::__cxx11::string::~string((string *)&test_read);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&test_read);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_11,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
                 ,0x2dd,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&test_read)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
      if ((long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                           (char)test_read.m_filename._M_dataplus._M_p) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(test_read.m_filename._M_dataplus._M_p._1_7_,
                                       (char)test_read.m_filename._M_dataplus._M_p) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    std::__cxx11::string::string
              ((string *)&local_218,"tests/test_write_index_order.pfb",(allocator *)&local_390);
    gtest_ar._0_4_ = PFData::writeFile(&test,&local_218);
    gtest_ar_11.success_ = false;
    gtest_ar_11._1_3_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&test_read,"test.writeFile(\"tests/test_write_index_order.pfb\")","0",
               (int *)&gtest_ar,(int *)&gtest_ar_11);
    std::__cxx11::string::~string((string *)&local_218);
    if ((char)test_read.m_filename._M_dataplus._M_p != '\0') {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&test_read.m_filename._M_string_length);
      std::__cxx11::string::string
                ((string *)&local_238,"tests/test_write_index_order.pfb",(allocator *)&gtest_ar);
      PFData::PFData(&test_read,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      PFData::loadHeader(&test_read);
      PFData::loadData(&test_read);
      PFData::getIndexOrder_abi_cxx11_((string *)&gtest_ar,&test_read);
      iVar1 = 0x13c174;
      testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
                ((internal *)&gtest_ar_11,"\"zyx\"","test_read.getIndexOrder()",(char (*) [4])"zyx",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if (gtest_ar_11.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar_11.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar_11.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_390,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
                   ,0x2e6,pcVar2);
        message = &gtest_ar;
        testing::internal::AssertHelper::operator=(&local_390,(Message *)message);
        iVar1 = (int)message;
        testing::internal::AssertHelper::~AssertHelper(&local_390);
        if ((long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_11.message_);
      PFData::close(&test,iVar1);
      PFData::close(&test_read,iVar1);
      gtest_ar_11.success_ = false;
      gtest_ar_11._1_3_ = 0;
      local_390.data_._0_4_ = remove("tests/test_write_index_order.pfb");
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"0","remove(\"tests/test_write_index_order.pfb\")",
                 (int *)&gtest_ar_11,(int *)&local_390);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_11);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_390,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
                   ,0x2ea,pcVar2);
        testing::internal::AssertHelper::operator=(&local_390,(Message *)&gtest_ar_11);
        testing::internal::AssertHelper::~AssertHelper(&local_390);
        if ((long *)CONCAT44(gtest_ar_11._4_4_,gtest_ar_11._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(gtest_ar_11._4_4_,gtest_ar_11._0_4_) + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      PFData::~PFData(&test_read);
      goto LAB_001192f1;
    }
    testing::Message::Message((Message *)&gtest_ar);
    if (test_read.m_filename._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)test_read.m_filename._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hydroframe[P]parflowio/tests/PFData_test.cpp"
               ,0x2e0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11,(Message *)&gtest_ar);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11);
  if ((long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(gtest_ar._4_4_,gtest_ar._0_4_) + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&test_read.m_filename._M_string_length);
LAB_001192f1:
  PFData::~PFData(&test);
  return;
}

Assistant:

TEST_F(PFData_test, setIndexOrder) {
    PFData test = PFData();
    double data[24];
    for (int i =0; i<24; i++) {
        data[i] = (double) rand() / 1000;
    }
    test.setData(data);

    // Should equal "zyz"
    EXPECT_EQ(test.getIndexOrder(), "zyx");

    // Should equal "xyz"
    test.setIndexOrder("xyz");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should equal "xyz"
    test.setIndexOrder("xYz");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should equal "xyz"
    test.setIndexOrder("xYZ");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should equal "xyz"
    test.setIndexOrder("XYZ");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should equal "xyz"
    test.setIndexOrder("XYZZZZ");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should not work, should still equal "xyz"
    test.setIndexOrder("abc");
    EXPECT_EQ(test.getIndexOrder(), "xyz");

    // Should not be able to write to file when indexOrder == "xyz"
    ASSERT_EQ(test.writeFile("tests/test_write_index_order.pfb"), 1);

    // Should equal "zyx"
    test.setIndexOrder("ZYX");
    EXPECT_EQ(test.getIndexOrder(), "zyx");

    // Should equal "zyx"
    test.setIndexOrder("zYx");
    EXPECT_EQ(test.getIndexOrder(), "zyx");

    // Should be able to write to file
    ASSERT_EQ(test.writeFile("tests/test_write_index_order.pfb"), 0);

    // Read file, indexOrder should equal "zyx"
    PFData test_read = PFData("tests/test_write_index_order.pfb");
    test_read.loadHeader();
    test_read.loadData();
    EXPECT_EQ("zyx", test_read.getIndexOrder());

    test.close();
    test_read.close();
    ASSERT_EQ(0, remove("tests/test_write_index_order.pfb"));
}